

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,char *s)

{
  int *piVar1;
  uchar uVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  CBStringException *pCVar6;
  long lVar7;
  int iVar8;
  CBStringException bstr__cppwrapper_exception;
  string local_78;
  string local_58;
  CBStringException local_38;
  
  iVar5 = (this->super_tagbstring).mlen;
  if (iVar5 < 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"CBString::Write protection error","");
    CBStringException::CBStringException(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pCVar6 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar6,&local_38);
    __cxa_throw(pCVar6,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  iVar8 = (this->super_tagbstring).slen;
  iVar4 = iVar5 - iVar8;
  if (iVar4 == 0 || iVar5 < iVar8) {
    iVar4 = 0;
  }
  else {
    puVar3 = (this->super_tagbstring).data;
    lVar7 = 0;
    do {
      uVar2 = s[lVar7];
      puVar3[lVar7 + iVar8] = uVar2;
      if (uVar2 == '\0') {
        piVar1 = &(this->super_tagbstring).slen;
        *piVar1 = *piVar1 + (int)lVar7;
        return this;
      }
      lVar7 = lVar7 + 1;
    } while (iVar4 != (int)lVar7);
    iVar8 = (this->super_tagbstring).slen;
    s = s + lVar7;
  }
  (this->super_tagbstring).slen = iVar8 + iVar4;
  iVar5 = bcatcstr(&this->super_tagbstring,s);
  if (iVar5 != -1) {
    return this;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"CBString::Failure in concatenate","");
  CBStringException::CBStringException(&local_38,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  pCVar6 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar6,&local_38);
  __cxa_throw(pCVar6,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator += (const char *s) {
	char * d;
	int i, l;

	if (mlen <= 0) bstringThrow ("Write protection error");

	/* Optimistically concatenate directly */
	l = mlen - slen;
	d = (char *) &data[slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			slen += i;
			return *this;
		}
	}
	slen += i;

	if (BSTR_ERR == bcatcstr (this, s)) {
		bstringThrow ("Failure in concatenate");
	}
	return *this;
}